

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O2

path * __thiscall Omega_h::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  long lVar2;
  string local_50;
  string_type filename_str;
  
  filename((path *)&local_50,this);
  std::__cxx11::string::string((string *)&filename_str,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  lVar2 = std::__cxx11::string::rfind((char)&filename_str,0x2e);
  if (lVar2 != -1) {
    bVar1 = std::operator==(&filename_str,".");
    if (!bVar1) {
      bVar1 = std::operator==(&filename_str,"..");
      if ((!bVar1) && (lVar2 != 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)&filename_str);
        path(__return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        goto LAB_00290c67;
      }
    }
  }
  (__return_storage_ptr__->impl).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->impl).field_2 + 8) = 0;
  (__return_storage_ptr__->impl)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->impl).field_2
  ;
  (__return_storage_ptr__->impl)._M_string_length = 0;
LAB_00290c67:
  std::__cxx11::string::~string((string *)&filename_str);
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const {
  auto const filename_str = filename().native();
  auto const last_dot_pos = filename_str.find_last_of('.');
  // If the pathname is either . or .., or if filename() does not contain the .
  // character, then empty path is returned.
  if (last_dot_pos == std::string::npos) return path();
  if (filename_str == "." || filename_str == "..") return path();
  // If the first character in the filename is a period, that period is ignored
  // (a filename like ".profile" is not treated as an extension)
  if (last_dot_pos == 0) return path();
  // If the filename() component of the generic-format path contains a period
  // (.), and is not one of the special filesystem elements dot or dot-dot, then
  // the extension is the substring beginning at the rightmost period (including
  // the period) and until the end of the pathname.
  return filename_str.substr(last_dot_pos, std::string::npos);
}